

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O2

void p2sc_write(p2sc_iofile_t *f,char *buf,gssize len)

{
  int iVar1;
  char *fmt;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar5;
  gchar *pgVar4;
  gsize count;
  GError *err;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (len < 0) {
    len = strlen(buf);
  }
  err = (GError *)0x0;
  iVar1 = g_io_channel_write_chars(f->io,buf,len,&count,&err);
  if ((err == (GError *)0x0) || (pgVar4 = err->message, pgVar4 == (gchar *)0x0)) {
    if (iVar1 == 1) {
      if (count == len) {
        return;
      }
      uVar2 = *(undefined4 *)&f->name;
      uVar3 = (undefined4)f->lineno;
      fmt = "%s:%zd: error writing %zd bytes: %zd written";
      iVar1 = 0xee;
      pgVar4 = (gchar *)count;
    }
    else {
      uVar2 = *(undefined4 *)&f->name;
      uVar3 = (undefined4)f->lineno;
      pgVar4 = (gchar *)CONCAT44(uVar5,iVar1);
      fmt = "%s:%zd: error writing with status %d";
      iVar1 = 0xe9;
    }
  }
  else {
    uVar2 = *(undefined4 *)&f->name;
    uVar3 = (undefined4)f->lineno;
    fmt = "%s:%zd: error writing: %s";
    iVar1 = 0xe3;
  }
  _p2sc_msg("p2sc_write",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,iVar1,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,fmt,uVar2,uVar3,
            pgVar4);
  exit(1);
}

Assistant:

void p2sc_write(p2sc_iofile_t *f, const char *buf, gssize len) {
    if (len < 0)
        len = strlen(buf);

    gsize count;
    GError *err = NULL;
    GIOStatus status = g_io_channel_write_chars(f->io, buf, len, &count, &err);

    if (err && err->message) {
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s:%zd: error writing: %s", f->name,
                 f->lineno, err->message);
        g_error_free(err);
    }

    if (status != G_IO_STATUS_NORMAL)
        P2SC_Msg(LVL_FATAL_FILESYSTEM,
                 "%s:%zd: error writing with status %d", f->name, f->lineno, (int) status);

    if (count != (gsize) len)
        P2SC_Msg(LVL_FATAL_FILESYSTEM,
                 "%s:%zd: error writing %zd bytes: %zd written", f->name,
                 f->lineno, count, (gsize) len);
}